

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O2

FilterCoordinator * __thiscall
helics::FilterFederate::getFilterCoordinator(FilterFederate *this,InterfaceHandle handle)

{
  iterator iVar1;
  __single_object ff;
  key_type local_24;
  __uniq_ptr_impl<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>
  local_20;
  
  local_24.hid = handle.hid;
  iVar1 = std::
          _Rb_tree<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>,_std::_Select1st<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>_>
          ::find(&(this->filterCoord)._M_t,&local_24);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->filterCoord)._M_t._M_impl.super__Rb_tree_header) {
    std::make_unique<helics::FilterCoordinator>();
    std::
    _Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,std::unique_ptr<helics::FilterCoordinator,std::default_delete<helics::FilterCoordinator>>>,std::_Select1st<std::pair<helics::InterfaceHandle_const,std::unique_ptr<helics::FilterCoordinator,std::default_delete<helics::FilterCoordinator>>>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,std::unique_ptr<helics::FilterCoordinator,std::default_delete<helics::FilterCoordinator>>>>>
    ::
    _M_emplace_unique<helics::InterfaceHandle&,std::unique_ptr<helics::FilterCoordinator,std::default_delete<helics::FilterCoordinator>>>
              ((_Rb_tree<helics::InterfaceHandle,std::pair<helics::InterfaceHandle_const,std::unique_ptr<helics::FilterCoordinator,std::default_delete<helics::FilterCoordinator>>>,std::_Select1st<std::pair<helics::InterfaceHandle_const,std::unique_ptr<helics::FilterCoordinator,std::default_delete<helics::FilterCoordinator>>>>,std::less<helics::InterfaceHandle>,std::allocator<std::pair<helics::InterfaceHandle_const,std::unique_ptr<helics::FilterCoordinator,std::default_delete<helics::FilterCoordinator>>>>>
                *)&this->filterCoord,&local_24,
               (unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>
                *)&local_20);
    std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>::
    ~unique_ptr((unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>
                 *)&local_20);
  }
  else {
    local_20._M_t.
    super__Tuple_impl<0UL,_helics::FilterCoordinator_*,_std::default_delete<helics::FilterCoordinator>_>
    .super__Head_base<0UL,_helics::FilterCoordinator_*,_false>._M_head_impl =
         (tuple<helics::FilterCoordinator_*,_std::default_delete<helics::FilterCoordinator>_>)
         iVar1._M_node[1]._M_parent;
  }
  return (FilterCoordinator *)
         local_20._M_t.
         super__Tuple_impl<0UL,_helics::FilterCoordinator_*,_std::default_delete<helics::FilterCoordinator>_>
         .super__Head_base<0UL,_helics::FilterCoordinator_*,_false>._M_head_impl;
}

Assistant:

FilterCoordinator* FilterFederate::getFilterCoordinator(InterfaceHandle handle)
{
    auto fnd = filterCoord.find(handle);
    if (fnd == filterCoord.end()) {
        // just make a dummy filterFunction so we have something to return
        auto ff = std::make_unique<FilterCoordinator>();
        auto* ffp = ff.get();
        filterCoord.emplace(handle, std::move(ff));
        return ffp;
    }
    return fnd->second.get();
}